

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_vfs_or_default_tell(ma_vfs *pVFS,ma_vfs_file file,ma_int64 *pCursor)

{
  ma_result mVar1;
  long lVar2;
  
  mVar1 = MA_INVALID_ARGS;
  if (pVFS == (ma_vfs *)0x0) {
    if ((pCursor != (ma_int64 *)0x0) && (*pCursor = 0, file != (ma_vfs_file)0x0)) {
      lVar2 = ftell((FILE *)file);
      *pCursor = lVar2;
      mVar1 = MA_SUCCESS;
    }
  }
  else if ((pCursor != (ma_int64 *)0x0) && (*pCursor = 0, file != (ma_vfs_file)0x0)) {
    if (*(code **)((long)pVFS + 0x30) != (code *)0x0) {
      mVar1 = (**(code **)((long)pVFS + 0x30))(pVFS,file,pCursor);
      return mVar1;
    }
    mVar1 = MA_NOT_IMPLEMENTED;
  }
  return mVar1;
}

Assistant:

MA_API ma_result ma_vfs_or_default_tell(ma_vfs* pVFS, ma_vfs_file file, ma_int64* pCursor)
{
    if (pVFS != NULL) {
        return ma_vfs_tell(pVFS, file, pCursor);
    } else {
        return ma_default_vfs_tell(pVFS, file, pCursor);
    }
}